

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::TryGetAttributes
          (LargeHeapBlock *this,LargeObjectHeader *header,uchar *pAttr)

{
  uint uVar1;
  uchar uVar2;
  LargeObjectHeader **ppLVar3;
  uint index;
  uchar *pAttr_local;
  LargeObjectHeader *header_local;
  LargeHeapBlock *this_local;
  
  if (header < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = header->objectIndex;
    if (uVar1 < this->allocCount) {
      ppLVar3 = HeaderList(this);
      if (ppLVar3[uVar1] == header) {
        uVar2 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
        *pAttr = uVar2;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
LargeHeapBlock::TryGetAttributes(LargeObjectHeader * header, unsigned char * pAttr)
{
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (index >= this->allocCount)
    {
        // Not allocated yet.
        return false;
    }

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    *pAttr = header->GetAttributes(this->heapInfo->recycler->Cookie);
    return true;
}